

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::visitCall(I64ToI32Lowering *this,Call *curr)

{
  bool bVar1;
  Module *pMVar2;
  Function *pFVar3;
  Call *pCVar4;
  bool local_291;
  string local_290;
  allocator<char> local_269;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  Name local_228;
  size_t local_218;
  char *local_210;
  anon_class_16_2_3fdeafed local_208;
  BuilderFunc<wasm::Call> local_1f8;
  Call *local_1d8;
  Call *fixedCall;
  Fatal local_1c0;
  BasicType local_34;
  size_t local_30;
  char *local_28;
  Type local_20;
  Call *local_18;
  Call *curr_local;
  I64ToI32Lowering *this_local;
  
  local_291 = false;
  local_18 = curr;
  curr_local = (Call *)this;
  if ((curr->isReturn & 1U) != 0) {
    pMVar2 = Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::getModule
                       (&(this->
                         super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                         ).
                         super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                         .
                         super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                       );
    local_30 = (local_18->target).super_IString.str._M_len;
    local_28 = (local_18->target).super_IString.str._M_str;
    pFVar3 = Module::getFunction(pMVar2,(Name)(local_18->target).super_IString.str);
    local_20 = Function::getResults(pFVar3);
    local_34 = i64;
    local_291 = wasm::Type::operator==(&local_20,&local_34);
  }
  pCVar4 = local_18;
  if (local_291 != false) {
    Fatal::Fatal(&local_1c0);
    Fatal::operator<<(&local_1c0,
                      (char (*) [62])"i64 to i32 lowering of return_call values not yet implemented"
                     );
    Fatal::~Fatal(&local_1c0);
  }
  local_208.curr = &local_18;
  local_208.this = this;
  std::
  function<wasm::Call*(std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>&,wasm::Type)>
  ::
  function<wasm::I64ToI32Lowering::visitCall(wasm::Call*)::_lambda(std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>&,wasm::Type)_1_,void>
            ((function<wasm::Call*(std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>&,wasm::Type)>
              *)&local_1f8,&local_208);
  pCVar4 = visitGenericCall<wasm::Call>(this,pCVar4,&local_1f8);
  std::
  function<wasm::Call_*(std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_&,_wasm::Type)>
  ::~function(&local_1f8);
  if (pCVar4 != (Call *)0x0) {
    local_1d8 = pCVar4;
    pMVar2 = Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::getModule
                       (&(this->
                         super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                         ).
                         super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                         .
                         super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                       );
    local_218 = (local_1d8->target).super_IString.str._M_len;
    local_210 = (local_1d8->target).super_IString.str._M_str;
    pFVar3 = Module::getFunction(pMVar2,(Name)(local_1d8->target).super_IString.str);
    bVar1 = Importable::imported(&pFVar3->super_Importable);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_268,"legalfunc$",&local_269);
      IString::toString_abi_cxx11_(&local_290,&(local_1d8->target).super_IString);
      std::operator+(&local_248,&local_268,&local_290);
      wasm::Name::Name(&local_228,&local_248);
      wasm::Name::operator=(&local_1d8->target,&local_228);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_268);
      std::allocator<char>::~allocator(&local_269);
    }
  }
  return;
}

Assistant:

void visitCall(Call* curr) {
    if (curr->isReturn &&
        getModule()->getFunction(curr->target)->getResults() == Type::i64) {
      Fatal()
        << "i64 to i32 lowering of return_call values not yet implemented";
    }
    auto* fixedCall = visitGenericCall<Call>(
      curr, [&](std::vector<Expression*>& args, Type results) {
        return builder->makeCall(curr->target, args, results, curr->isReturn);
      });
    // If this was to an import, we need to call the legal version. This assumes
    // that legalize-js-interface has been run before.
    if (fixedCall && getModule()->getFunction(fixedCall->target)->imported()) {
      fixedCall->target =
        std::string("legalfunc$") + fixedCall->target.toString();
      return;
    }
  }